

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_opt_mem.c
# Opt level: O3

TRef lj_opt_fwd_xload(jit_State *J)

{
  byte bVar1;
  ushort uVar2;
  ushort uVar3;
  AliasRet AVar4;
  TRef TVar5;
  long lVar6;
  ulong uVar7;
  cTValue *tv;
  byte bVar8;
  ushort uVar9;
  IRRef lim;
  uint uVar10;
  ulong uVar11;
  long lVar12;
  IRIns *pIVar13;
  uint uVar14;
  uint64_t u64;
  IRRef1 IVar15;
  IRIns *refa;
  uint uVar16;
  IRIns *pIVar17;
  IRRef lim_1;
  uint uVar18;
  
  uVar9 = (J->fold).ins.field_0.op1;
  uVar7 = (ulong)uVar9;
  pIVar17 = (J->cur).ir;
  refa = pIVar17 + uVar7;
  uVar3 = (J->fold).ins.field_0.op2;
  if ((uVar3 & 1) != 0) {
    uVar16 = (uint)uVar9;
    goto LAB_0012b9ca;
  }
  if ((uVar3 & 2) != 0) {
LAB_0012bc29:
    TVar5 = lj_ir_emit(J);
    return TVar5;
  }
  uVar14 = (uint)J->chain[0x4b];
  do {
    uVar18 = (uint)J->chain[0x5c];
    if ((uint)J->chain[0x5c] < (uint)uVar7) {
      uVar18 = (uint)uVar7;
    }
    if (uVar18 <= J->chain[0x54]) {
      uVar18 = (uint)J->chain[0x54];
    }
    while (uVar16 = uVar18, uVar18 < uVar14) {
      pIVar13 = pIVar17 + uVar14;
      AVar4 = aa_xref(J,refa,&(J->fold).ins,pIVar13);
      uVar16 = uVar14;
      if (AVar4 == ALIAS_MAY) break;
      if (AVar4 == ALIAS_MUST) {
        bVar8 = *(byte *)((long)&(J->fold).ins + 4);
        bVar1 = *(byte *)((long)pIVar17 + (ulong)(pIVar13->field_0).op2 * 8 + 4);
        if (((bVar1 ^ bVar8) & 0x1f) == 0) {
          return (uint)(pIVar13->field_0).op2;
        }
        uVar9 = bVar8 & 0x1f;
        if ((uVar9 == 0x11) || (uVar9 == 0xf)) {
          uVar3 = 0x13;
          uVar9 = uVar9 | 0x800;
        }
        else {
          uVar3 = 0x13;
          if ((bVar8 & 0x1d) != 0x10) {
            uVar3 = uVar9;
            uVar9 = bVar1 & 0x1f;
          }
        }
        (J->fold).ins.field_0.ot = uVar3 + 0x5500;
        (J->fold).ins.field_0.op1 = (pIVar13->field_0).op2;
        (J->fold).ins.field_0.op2 = uVar3 << 5 | uVar9;
        return 1;
      }
      uVar14 = (uint)(pIVar13->field_0).prev;
    }
LAB_0012b9ca:
    uVar9 = J->chain[0x44];
    while( true ) {
      if (uVar9 <= uVar16) break;
      uVar11 = (ulong)uVar9;
      if (((uint)uVar7 == (uint)pIVar17[uVar11].field_0.op1) &&
         ((((J->fold).ins.field_1.t.irt ^ *(byte *)((long)pIVar17 + uVar11 * 8 + 4)) & 0x1f) == 0))
      {
        return (uint)uVar9;
      }
      uVar9 = *(ushort *)((long)pIVar17 + uVar11 * 8 + 6);
    }
    if ((((((ulong)(J->fold).ins & 0x10000) != 0) || (J->chain[0x11] == 0)) ||
        ((uint)uVar7 != (uint)(J->fold).ins.field_0.op1)) || ((refa->field_1).o != '('))
    goto LAB_0012bc29;
    lVar12 = (long)(short)(refa->field_0).op2;
    lVar6 = 0;
    if (-1 < lVar12) {
      if (*(char *)((long)pIVar17 + lVar12 * 8 + 5) == '\x1c') {
        lVar6 = *(long *)(ulong)pIVar17[lVar12].field_1.op12;
      }
      else {
        lVar6 = (long)(int)pIVar17[lVar12].field_1.op12;
      }
      refa = pIVar17 + (refa->field_0).op1;
      if ((refa->field_1).o != '(') goto LAB_0012bc29;
    }
    pIVar13 = pIVar17 + (refa->field_0).op1;
    if ((pIVar13->field_1).o == '(') {
      bVar8 = 1;
      if ((pIVar13->field_0).op1 != (pIVar13->field_0).op2) goto LAB_0012baae;
    }
    else if (((pIVar13->field_1).o == '#') && (-1 < (long)(short)(pIVar13->field_0).op2)) {
      bVar8 = (byte)pIVar17[(short)(pIVar13->field_0).op2].field_1.op12;
    }
    else {
LAB_0012baae:
      bVar8 = 0;
      pIVar13 = refa;
    }
    uVar7 = (ulong)(pIVar13->field_0).op1;
    if (((*(char *)((long)pIVar17 + uVar7 * 8 + 5) != '(') ||
        ((*(byte *)((long)pIVar17 + uVar7 * 8 + 4) & 0x1f) != 0x13)) ||
       (lVar12 = (long)*(short *)((long)pIVar17 + uVar7 * 8 + 2), lVar12 < 0)) goto LAB_0012bc29;
    u64 = ((long)pIVar17[lVar12].i << (bVar8 & 0x3f)) + lVar6;
    uVar9 = pIVar17[uVar7].field_0.op1;
    if (pIVar13 == refa) {
      uVar14 = (uint)uVar9;
    }
    else if ((ulong)(pIVar13->field_1).o == 0x23) {
      uVar3 = (pIVar13->field_0).op2;
      uVar2 = uVar9;
      if (uVar3 < uVar9) {
        uVar2 = uVar3;
      }
      if (uVar3 >= uVar9 && uVar3 != uVar9) {
        uVar9 = uVar3;
      }
      IVar15 = J->chain[0x23];
      while( true ) {
        uVar14 = (uint)IVar15;
        if (IVar15 <= uVar9) goto LAB_0012bc29;
        uVar7 = (ulong)IVar15;
        if ((uVar9 == pIVar17[uVar7].field_0.op1) &&
           (uVar2 == *(ushort *)((long)pIVar17 + uVar7 * 8 + 2))) break;
        IVar15 = *(ushort *)((long)pIVar17 + uVar7 * 8 + 6);
      }
    }
    else {
      uVar3 = J->chain[(pIVar13->field_1).o];
      while( true ) {
        if (uVar3 <= uVar9) goto LAB_0012bc29;
        uVar7 = (ulong)uVar3;
        uVar14 = (uint)uVar3;
        if ((uVar9 == pIVar17[uVar7].field_0.op1) &&
           (uVar9 == *(ushort *)((long)pIVar17 + uVar7 * 8 + 2))) break;
        uVar3 = *(ushort *)((long)pIVar17 + uVar7 * 8 + 6);
      }
    }
    uVar10 = (uint)(refa->field_0).op2;
    uVar18 = uVar14;
    if (uVar10 < uVar14) {
      uVar18 = uVar10;
    }
    if (uVar14 < uVar10) {
      uVar14 = (uint)(refa->field_0).op2;
    }
    uVar9 = J->chain[0x28];
    while( true ) {
      if (uVar9 <= uVar14) goto LAB_0012bc29;
      uVar7 = (ulong)uVar9;
      if ((uVar14 == pIVar17[uVar7].field_0.op1) &&
         (uVar18 == *(ushort *)((long)pIVar17 + uVar7 * 8 + 2))) break;
      uVar9 = *(ushort *)((long)pIVar17 + uVar7 * 8 + 6);
    }
    if (u64 == 0) {
      uVar7 = (ulong)(uint)uVar9;
    }
    else {
      tv = lj_ir_k64_find(J,u64);
      TVar5 = lj_ir_k64(J,IR_KINT64,tv);
      uVar10 = TVar5 & 0xffff;
      uVar18 = (uint)uVar9;
      uVar14 = uVar18;
      if (uVar10 < uVar18) {
        uVar14 = uVar10;
      }
      if (uVar18 < uVar10) {
        uVar18 = uVar10;
      }
      uVar9 = J->chain[0x28];
      if (uVar9 <= uVar18) goto LAB_0012bc29;
      pIVar17 = (J->cur).ir;
      while( true ) {
        uVar7 = (ulong)uVar9;
        uVar11 = (ulong)uVar9;
        if ((uVar18 == pIVar17[uVar11].field_0.op1) &&
           (uVar14 == *(ushort *)((long)pIVar17 + uVar11 * 8 + 2))) break;
        uVar9 = *(ushort *)((long)pIVar17 + uVar11 * 8 + 6);
        if (uVar9 <= uVar18) goto LAB_0012bc29;
      }
    }
    for (uVar9 = J->chain[0x4b]; uVar14 = (uint)uVar9, uVar16 < uVar14;
        uVar9 = *(ushort *)((long)pIVar17 + (ulong)uVar9 * 8 + 6)) {
    }
    refa = pIVar17 + uVar7;
  } while( true );
}

Assistant:

TRef LJ_FASTCALL lj_opt_fwd_xload(jit_State *J)
{
  IRRef xref = fins->op1;
  IRIns *xr = IR(xref);
  IRRef lim = xref;  /* Search limit. */
  IRRef ref;

  if ((fins->op2 & IRXLOAD_READONLY))
    goto cselim;
  if ((fins->op2 & IRXLOAD_VOLATILE))
    goto doemit;

  /* Search for conflicting stores. */
  ref = J->chain[IR_XSTORE];
retry:
  if (J->chain[IR_CALLXS] > lim) lim = J->chain[IR_CALLXS];
  if (J->chain[IR_XBAR] > lim) lim = J->chain[IR_XBAR];
  while (ref > lim) {
    IRIns *store = IR(ref);
    switch (aa_xref(J, xr, fins, store)) {
    case ALIAS_NO:   break;  /* Continue searching. */
    case ALIAS_MAY:  lim = ref; goto cselim;  /* Limit search for load. */
    case ALIAS_MUST:
      /* Emit conversion if the loaded type doesn't match the forwarded type. */
      if (!irt_sametype(fins->t, IR(store->op2)->t)) {
	IRType dt = irt_type(fins->t), st = irt_type(IR(store->op2)->t);
	if (dt == IRT_I8 || dt == IRT_I16) {  /* Trunc + sign-extend. */
	  st = dt | IRCONV_SEXT;
	  dt = IRT_INT;
	} else if (dt == IRT_U8 || dt == IRT_U16) {  /* Trunc + zero-extend. */
	  st = dt;
	  dt = IRT_INT;
	}
	fins->ot = IRT(IR_CONV, dt);
	fins->op1 = store->op2;
	fins->op2 = (dt<<5)|st;
	return RETRYFOLD;
      }
      return store->op2;  /* Store forwarding. */
    }
    ref = store->prev;
  }

cselim:
  /* Try to find a matching load. Below the conflicting store, if any. */
  ref = J->chain[IR_XLOAD];
  while (ref > lim) {
    /* CSE for XLOAD depends on the type, but not on the IRXLOAD_* flags. */
    if (IR(ref)->op1 == xref && irt_sametype(IR(ref)->t, fins->t))
      return ref;
    ref = IR(ref)->prev;
  }

  /* Reassociate XLOAD across PHIs to handle a[i-1] forwarding case. */
  if (!(fins->op2 & IRXLOAD_READONLY) && J->chain[IR_LOOP] &&
      xref == fins->op1 && (xref = reassoc_xref(J, xr)) != 0) {
    ref = J->chain[IR_XSTORE];
    while (ref > lim)  /* Skip stores that have already been checked. */
      ref = IR(ref)->prev;
    lim = xref;
    xr = IR(xref);
    goto retry;  /* Retry with the reassociated reference. */
  }
doemit:
  return EMITFOLD;
}